

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void Map_DecreaseStorageKeysValues(MAP_HANDLE_DATA *handleData)

{
  undefined1 auVar1 [16];
  char **ppcVar2;
  LOGGER_LOG p_Var3;
  size_t local_50;
  size_t local_48;
  ulong local_40;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t realloc_size;
  char **undoneKeys;
  char **undoneValues;
  MAP_HANDLE_DATA *handleData_local;
  
  if (handleData->count == 1) {
    free(handleData->keys);
    handleData->keys = (char **)0x0;
    free(handleData->values);
    handleData->values = (char **)0x0;
    handleData->count = 0;
    handleData->mapFilterCallback = (MAP_FILTER_CALLBACK)0x0;
  }
  else {
    if (handleData->count == 0) {
      local_40 = 0xffffffffffffffff;
    }
    else {
      local_40 = handleData->count - 1;
    }
    if (local_40 == 0) {
      local_48 = 0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_40;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < 8) {
        local_50 = 0xffffffffffffffff;
      }
      else {
        local_50 = local_40 << 3;
      }
      local_48 = local_50;
    }
    if ((local_48 == 0xffffffffffffffff) ||
       (ppcVar2 = (char **)realloc(handleData->keys,local_48), ppcVar2 == (char **)0x0)) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/map.c"
                  ,"Map_DecreaseStorageKeysValues",0xf0,1,
                  "CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu",
                  local_48);
      }
    }
    else {
      handleData->keys = ppcVar2;
    }
    if ((local_48 == 0xffffffffffffffff) ||
       (ppcVar2 = (char **)realloc(handleData->values,local_48), ppcVar2 == (char **)0x0)) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/map.c"
                  ,"Map_DecreaseStorageKeysValues",0xfa,1,
                  "CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu",
                  local_48);
      }
    }
    else {
      handleData->values = ppcVar2;
    }
    handleData->count = handleData->count - 1;
  }
  return;
}

Assistant:

static void Map_DecreaseStorageKeysValues(MAP_HANDLE_DATA* handleData)
{
    if (handleData->count == 1)
    {
        free(handleData->keys);
        handleData->keys = NULL;
        free(handleData->values);
        handleData->values = NULL;
        handleData->count = 0;
        handleData->mapFilterCallback = NULL;
    }
    else
    {
        /*certainly > 1...*/
        char** undoneValues;
        char** undoneKeys;
        size_t realloc_size = safe_subtract_size_t(handleData->count, 1);
        realloc_size = safe_multiply_size_t(realloc_size, sizeof(char*));

        if (realloc_size == SIZE_MAX ||
            (undoneKeys = (char**)realloc(handleData->keys, realloc_size)) == NULL)
        {
            LogError("CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu", realloc_size);
        }
        else
        {
            handleData->keys = undoneKeys;
        }

        if (realloc_size == SIZE_MAX || 
            (undoneValues = (char**)realloc(handleData->values, realloc_size)) == NULL)
        {
            LogError("CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu", realloc_size);
        }
        else
        {
            handleData->values = undoneValues;
        }

        handleData->count--;
    }
}